

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O3

Value * __thiscall iqxmlrpc::Value::operator[](Value *this,char *s)

{
  Struct *this_00;
  Value *pVVar1;
  allocator<char> local_39;
  string local_38;
  
  this_00 = cast<iqxmlrpc::Struct>(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,s,&local_39);
  pVVar1 = Struct::operator[](this_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pVVar1;
}

Assistant:

Value& Value::operator []( const char* s )
{
  return (*cast<Struct>())[s];
}